

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode AllowServerConnect(connectdata *conn,_Bool *connected)

{
  Curl_easy *data;
  long lVar1;
  CURLcode CVar2;
  time_t tVar3;
  
  data = conn->data;
  *connected = false;
  Curl_infof(data,"Preparing for accepting server on data port\n");
  Curl_pgrsTime(data,TIMER_STARTACCEPT);
  tVar3 = ftp_timeleft_accept(data);
  if (tVar3 < 0) {
    Curl_failf(data,"Accept timeout occurred while waiting server connect");
    CVar2 = CURLE_FTP_ACCEPT_TIMEOUT;
  }
  else {
    CVar2 = ReceivedServerConnect(conn,connected);
    if (CVar2 == CURLE_OK) {
      if (*connected == true) {
        CVar2 = AcceptServerConnect(conn);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
        CVar2 = InitiateTransfer(conn);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
      }
      else {
        lVar1 = (data->set).accepttimeout;
        tVar3 = 60000;
        if (0 < lVar1) {
          tVar3 = lVar1;
        }
        Curl_expire(data,tVar3,EXPIRE_100_TIMEOUT);
      }
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode AllowServerConnect(struct connectdata *conn, bool *connected)
{
  struct Curl_easy *data = conn->data;
  time_t timeout_ms;
  CURLcode result = CURLE_OK;

  *connected = FALSE;
  infof(data, "Preparing for accepting server on data port\n");

  /* Save the time we start accepting server connect */
  Curl_pgrsTime(data, TIMER_STARTACCEPT);

  timeout_ms = ftp_timeleft_accept(data);
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* see if the connection request is already here */
  result = ReceivedServerConnect(conn, connected);
  if(result)
    return result;

  if(*connected) {
    result = AcceptServerConnect(conn);
    if(result)
      return result;

    result = InitiateTransfer(conn);
    if(result)
      return result;
  }
  else {
    /* Add timeout to multi handle and break out of the loop */
    if(!result && *connected == FALSE) {
      Curl_expire(data, data->set.accepttimeout > 0 ?
                  data->set.accepttimeout: DEFAULT_ACCEPT_TIMEOUT, 0);
    }
  }

  return result;
}